

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBoxPrivate::setClickedButton(QMessageBoxPrivate *this,QAbstractButton *button)

{
  int iVar1;
  QMessageBox *pQVar2;
  QAbstractButton *in_RSI;
  QMessageBoxPrivate *in_RDI;
  QAbstractButton *in_stack_00000008;
  int resultCode;
  QMessageBox *q;
  QMessageBoxPrivate *this_00;
  
  this_00 = in_RDI;
  pQVar2 = q_func(in_RDI);
  in_RDI->clickedButton = in_RSI;
  QMessageBox::buttonClicked((QMessageBox *)0x7a44c9,(QAbstractButton *)in_RDI);
  iVar1 = execReturnCode(this_00,in_stack_00000008);
  (**(code **)(*(long *)&(pQVar2->super_QDialog).super_QWidget + 0x1b0))(pQVar2,iVar1);
  return;
}

Assistant:

void QMessageBoxPrivate::setClickedButton(QAbstractButton *button)
{
    Q_Q(QMessageBox);

    clickedButton = button;
    emit q->buttonClicked(clickedButton);

    auto resultCode = execReturnCode(button);
    q->done(resultCode);
}